

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O2

vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> * __thiscall
SkipList::GetUpperNodes
          (vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *__return_storage_ptr__,
          SkipList *this,int inKey)

{
  int iVar1;
  Node *__x;
  Node *pNVar2;
  bool bVar3;
  
  pNVar2 = this->header->next;
  iVar1 = this->height;
  (__return_storage_ptr__->super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::reserve
            (__return_storage_ptr__,(long)iVar1);
LAB_00102b49:
  do {
    bVar3 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar3) {
      if ((long)(__return_storage_ptr__->
                super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->
                super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == (long)this->height) {
        return __return_storage_ptr__;
      }
      __assert_fail("(height == upperNodes.size()) && \"upperNodes contains more nodes than height of list\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_3_data_and_algorithms/ch_18/p3ch18ex11.cpp"
                    ,0x11b,"std::vector<Node *> SkipList::GetUpperNodes(const int) const");
    }
    do {
      __x = pNVar2;
      if (__x == (Node *)0x0) {
        pNVar2 = (Node *)0x0;
        goto LAB_00102b49;
      }
    } while ((__x->key < inKey) && (pNVar2 = __x->next, __x->next != (Node *)0x0));
    std::vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::push_back
              (__return_storage_ptr__,&__x->prev);
    pNVar2 = __x->prev->bot;
  } while( true );
}

Assistant:

std::vector<Node*> SkipList::GetUpperNodes(const int inKey) const
{
	Node* node = header->next;
	int lvl = height;
	std::vector<Node*> upperNodes;
	upperNodes.reserve(height);
	while (lvl-- != 0)
	{
		while (node)
		{
			if (node->key < inKey && node->next)
			{
				node = node->next;
			}
			else
			{
				upperNodes.push_back(node->prev);
				node = node->prev->bot;
				break;
			}
		}
	}

	assert((height == upperNodes.size()) && "upperNodes contains more nodes than height of list");

	return upperNodes;
}